

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi.h
# Opt level: O0

void stbi__tga_read_rgb16(stbi__context *s,stbi_uc *out)

{
  uint uVar1;
  int b;
  int g;
  int r;
  stbi__uint16 fiveBitMask;
  stbi__uint16 px;
  stbi_uc *out_local;
  stbi__context *s_local;
  
  uVar1 = stbi__get16le(s);
  *out = (stbi_uc)((ulong)(long)(int)(((int)(uVar1 & 0xffff) >> 10 & 0x1fU) * 0xff) / 0x1f);
  out[1] = (stbi_uc)((ulong)(long)(int)(((int)(uVar1 & 0xffff) >> 5 & 0x1fU) * 0xff) / 0x1f);
  out[2] = (stbi_uc)((ulong)(long)(int)((uint)((ushort)uVar1 & 0x1f) * 0xff) / 0x1f);
  return;
}

Assistant:

static void stbi__tga_read_rgb16(stbi__context *s, stbi_uc* out)
{
   stbi__uint16 px = (stbi__uint16)stbi__get16le(s);
   stbi__uint16 fiveBitMask = 31;
   // we have 3 channels with 5bits each
   int r = (px >> 10) & fiveBitMask;
   int g = (px >> 5) & fiveBitMask;
   int b = px & fiveBitMask;
   // Note that this saves the data in RGB(A) order, so it doesn't need to be swapped later
   out[0] = (stbi_uc)((r * 255)/31);
   out[1] = (stbi_uc)((g * 255)/31);
   out[2] = (stbi_uc)((b * 255)/31);

   // some people claim that the most significant bit might be used for alpha
   // (possibly if an alpha-bit is set in the "image descriptor byte")
   // but that only made 16bit test images completely translucent..
   // so let's treat all 15 and 16bit TGAs as RGB with no alpha.
}